

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O0

int __thiscall
pele::physics::reactions::ReactorCvode::react
          (ReactorCvode *this,realtype *rY_in,realtype *rYsrc_in,realtype *rX_in,realtype *rX_src_in
          ,realtype *dt_react,realtype *time,int ncells)

{
  int iVar1;
  Context *cvode_mem;
  void *in_RCX;
  void *in_RDX;
  Context *in_RSI;
  ReactorBase *in_RDI;
  void *in_R8;
  double *in_R9;
  double *in_stack_00000008;
  int in_stack_00000010;
  long nfeLS;
  long nfe;
  int i;
  int flag;
  Real *yvec_d;
  int omp_thread;
  Real CvodeActual_time_final;
  Real time_final;
  Real time_start;
  undefined1 in_stack_00001187;
  void *in_stack_00001188;
  ReactorCvode *in_stack_00001190;
  char (*in_stack_fffffffffffffbf8) [28];
  char (*x) [41];
  Print *in_stack_fffffffffffffc00;
  N_Vector in_stack_fffffffffffffc08;
  void *in_stack_fffffffffffffc10;
  long *nfevalsLS;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined4 uVar2;
  ostream *os_;
  Print *this_00;
  undefined8 in_stack_fffffffffffffc48;
  realtype *in_stack_fffffffffffffc50;
  N_Vector in_stack_fffffffffffffc58;
  realtype in_stack_fffffffffffffc60;
  void *in_stack_fffffffffffffc68;
  Print *in_stack_fffffffffffffc70;
  Print local_228;
  int local_a0;
  undefined1 local_89 [37];
  int local_64;
  realtype *local_60;
  int local_54;
  undefined8 local_50;
  double local_48;
  string *solvername;
  ReactorBase *this_01;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  this_01 = in_RDI;
  std::operator<<((ostream *)&std::cout,"Reacting (flattened)\n");
  solvername = (string *)*in_stack_00000008;
  local_48 = *in_stack_00000008 + *in_R9;
  local_50 = 0;
  local_54 = 0;
  local_60 = N_VGetArrayPointer((N_Vector)0x314834);
  memcpy(local_60,in_RSI,(long)(in_stack_00000010 * 0x16) << 3);
  memcpy(*(void **)((long)in_RDI[1].m_typ_vals._M_elems[8] + 0x38),in_RDX,
         (long)(in_stack_00000010 * 0x15) << 3);
  memcpy(*(void **)((long)in_RDI[1].m_typ_vals._M_elems[8] + 0x28),in_RCX,
         (long)in_stack_00000010 << 3);
  memcpy(*(void **)((long)in_RDI[1].m_typ_vals._M_elems[8] + 0x30),in_R8,
         (long)in_stack_00000010 << 3);
  CVodeReInit((void *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
              (realtype)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  local_64 = CVode(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc50,iVar1);
  iVar1 = utils::check_flag(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                            (int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
  if (iVar1 == 0) {
    amrex::OpenMP::get_thread_num();
    cvode_mem = amrex::sundials::The_Sundials_Context(0);
    nfevalsLS = (long *)in_RDI[1].m_typ_vals._M_elems[7];
    uVar2 = *(undefined4 *)((long)in_RDI[1].m_typ_vals._M_elems[8] + 8);
    os_ = *(ostream **)&in_RDI[1].verbose;
    this_00 = (Print *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"cvode",(allocator *)this_00);
    ReactorBase::set_sundials_solver_tols
              (this_01,in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(Real)in_R8,(Real)in_R9,solvername
              );
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    memcpy(in_RSI,local_60,(long)(in_stack_00000010 * 0x16) << 3);
    for (local_a0 = 0; local_a0 < in_stack_00000010; local_a0 = local_a0 + 1) {
      *(double *)((long)in_RCX + (long)local_a0 * 8) =
           *in_R9 * *(double *)((long)in_R8 + (long)local_a0 * 8) +
           *(double *)((long)in_RCX + (long)local_a0 * 8);
    }
    if ((1 < *(int *)((long)in_RDI[1].m_typ_vals._M_elems[8] + 0xc)) && (local_54 == 0)) {
      amrex::OutStream();
      in_stack_fffffffffffffc00 = &local_228;
      amrex::Print::Print(this_00,os_);
      amrex::Print::operator<<(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      amrex::Print::~Print(in_stack_fffffffffffffc70);
      print_final_stats(in_stack_00001190,in_stack_00001188,(bool)in_stack_00001187);
      amrex::OutStream();
      x = (char (*) [41])&stack0xfffffffffffffc50;
      amrex::Print::Print(this_00,os_);
      amrex::Print::operator<<(in_stack_fffffffffffffc00,x);
      amrex::Print::~Print(in_stack_fffffffffffffc70);
    }
    CVodeGetNumRhsEvals(cvode_mem,(long *)in_stack_fffffffffffffc00);
    if (in_RDI[1].m_typ_vals._M_elems[4] != 0.0) {
      CVodeGetNumLinRhsEvals((void *)CONCAT44(uVar2,in_stack_fffffffffffffc18),nfevalsLS);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
ReactorCvode::react(
  realtype* rY_in,
  realtype* rYsrc_in,
  realtype* rX_in,
  realtype* rX_src_in,
  realtype& dt_react,
  realtype& time,
  int ncells
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t stream
#endif
)
{
  BL_PROFILE("Pele::ReactorCvode::react()");

  std::cout << "Reacting (flattened)\n";

  // CPU and GPU version are very different such that the entire file
  // is split between a GPU region and a CPU region

  amrex::Real time_start = time;
  amrex::Real time_final = time + dt_react;
  amrex::Real CvodeActual_time_final = 0.0;

  //----------------------------------------------------------
  // GPU Region
  //----------------------------------------------------------
#ifdef AMREX_USE_GPU
  int neq_tot = (NUM_SPECIES + 1) * ncells;
  SUNNonlinearSolver NLS = nullptr;
  SUNLinearSolver LS = nullptr;
  SUNMatrix A = nullptr;
  void* cvode_mem = nullptr;

  // Fill user_data
  amrex::Gpu::streamSynchronize();
  CVODEUserData* user_data = new CVODEUserData{};
  allocUserData(user_data, ncells, A, stream);

  // Solution vector and execution policy
  auto y = utils::setNVectorGPU(neq_tot, atomic_reductions, stream);

  // Solution data array
  amrex::Real* yvec_d = N_VGetDeviceArrayPointer(y);

  // Fill data
  BL_PROFILE_VAR("Pele::ReactorCvode::react():ASyncCopy", AsyncCopy);
  amrex::Gpu::htod_memcpy_async(yvec_d, rY_in, sizeof(amrex::Real) * (neq_tot));
  amrex::Gpu::htod_memcpy_async(
    user_data->rYsrc_ext, rYsrc_in, sizeof(amrex::Real) * NUM_SPECIES * ncells);
  amrex::Gpu::htod_memcpy_async(
    user_data->rhoe_init, rX_in, sizeof(amrex::Real) * ncells);
  amrex::Gpu::htod_memcpy_async(
    user_data->rhoesrc_ext, rX_src_in, sizeof(amrex::Real) * ncells);
  BL_PROFILE_VAR_STOP(AsyncCopy);

#ifdef AMREX_USE_OMP
  Gpu::Device::streamSynchronize();
#endif

  // Initialize integrator
  cvode_mem = CVodeCreate(CV_BDF, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(cvode_mem, "CVodeCreate", 0))
    return (1);
  int flag = CVodeSetUserData(cvode_mem, static_cast<void*>(user_data));

  // Call CVodeInit to initialize the integrator memory and specify the
  //  user's right hand side function, the inital time, and
  //  initial dependent variable vector y.
  flag = CVodeInit(cvode_mem, cF_RHS, time_start, y);
  if (utils::check_flag(&flag, "CVodeInit", 1))
    return (1);

  // Setup tolerances with typical values
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, user_data->ncells,
    relTol, absTol, "cvode");

  // Solver data
  if (user_data->solve_type == cvode::fixedPoint) {
    NLS = SUNNonlinSol_FixedPoint(
      y, max_fp_accel, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(NLS), "SUNNonlinSol_FixedPoint", 0)) {
      return (1);
    }

    flag = CVodeSetNonlinearSolver(cvode_mem, NLS);
    if (utils::check_flag(&flag, "CVodeSetNonlinearSolver", 1)) {
      return (1);
    }
  } else if (user_data->solve_type == cvode::sparseDirect) {
#if defined(AMREX_USE_CUDA)
    LS = SUNLinSol_cuSolverSp_batchQR(
      y, A, user_data->cusolverHandle,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(LS), "SUNLinSol_cuSolverSp_batchQR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);

#else
    amrex::Abort(
      "Shoudn't be there. solve_type sparse_direct only available with CUDA");
#endif
  } else if (user_data->solve_type == cvode::customDirect) {
#if defined(AMREX_USE_CUDA)
    LS = cvode::SUNLinSol_dense_custom(
      y, A, stream, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_dense_custom", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);

    flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
    if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type custom_direct only available with CUDA");
#endif
  } else if (user_data->solve_type == cvode::magmaDirect) {
#ifdef PELE_USE_MAGMA
    LS = SUNLinSol_MagmaDense(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_MagmaDense", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort(
      "Shoudn't be there. solve_type magma_direct only available with "
      "PELE_USE_MAGMA = TRUE");
#endif
  } else if (user_data->solve_type == cvode::GMRES) {
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_NONE, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
  } else if (user_data->solve_type == cvode::precGMRES) {
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_LEFT, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0))
      return (1);
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
  }

  // Analytical Jac. data for direct solver
  // Both sparse/custom direct uses the same Jacobian functions
  if (user_data->analytical_jacobian == 1) {
    flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
    if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
      return (1);
  }

  // Analytical Jac. data for iterative solver preconditioner
  if (user_data->precond_type == cvode::sparseSimpleAJac) {
    flag = CVodeSetPreconditioner(cvode_mem, cvode::Precond, cvode::PSolve);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1))
      return (1);
  }

  // CVODE runtime options
  flag = CVodeSetMaxNonlinIters(cvode_mem, max_nls_iters);
  if (utils::check_flag(&flag, "CVodeSetMaxNonlinIters", 1))
    return (1);
  flag = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (utils::check_flag(&flag, "CVodeSetMaxNumSteps", 1))
    return (1);
  flag = CVodeSetMaxOrd(cvode_mem, user_data->maxOrder);
  if (utils::check_flag(&flag, "CVodeSetMaxOrd", 1))
    return (1);

  // Actual CVODE solve
  BL_PROFILE_VAR("Pele::ReactorCvode::react():CVode", AroundCVODE);
  flag = CVode(cvode_mem, time_final, y, &CvodeActual_time_final, CV_NORMAL);
  if (utils::check_flag(&flag, "CVode", 1))
    return (1);
  BL_PROFILE_VAR_STOP(AroundCVODE);

#ifdef MOD_REACTOR
  dt_react =
    time_start - CvodeActual_time_final; // Actual dt_react performed by Cvode
  time += dt_react;                      // Increment time in reactor mode
#endif

#ifdef AMREX_USE_OMP
  Gpu::Device::streamSynchronize();
#endif

  // Get the result back
  BL_PROFILE_VAR_START(AsyncCopy);
  amrex::Gpu::dtoh_memcpy_async(rY_in, yvec_d, sizeof(amrex::Real) * neq_tot);
  for (int i = 0; i < ncells; i++) {
    rX_in[i] = rX_in[i] + dt_react * rX_src_in[i];
  }
  BL_PROFILE_VAR_STOP(AsyncCopy);

  // Get the number of RHS evaluations
  long int nfe;
  flag = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (user_data->verbose > 1) {
    print_final_stats(cvode_mem, LS != nullptr);
  }

  // Clean up
  N_VDestroy(y);
  CVodeFree(&cvode_mem);

  if (LS != nullptr) {
    SUNLinSolFree(LS);
  }
  if (A != nullptr) {
    SUNMatDestroy(A);
  }
  freeUserData(user_data);

  //----------------------------------------------------------
  // CPU Region
  //----------------------------------------------------------
#else
  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  // Pointer of solution vector
  amrex::Real* yvec_d = N_VGetArrayPointer(y);
  std::memcpy(
    yvec_d, rY_in, sizeof(amrex::Real) * ((NUM_SPECIES + 1) * ncells));
  std::memcpy(
    udata_g->rYsrc_ext, rYsrc_in, sizeof(amrex::Real) * (NUM_SPECIES * ncells));
  std::memcpy(udata_g->rhoe_init, rX_in, sizeof(amrex::Real) * ncells);
  std::memcpy(udata_g->rhoesrc_ext, rX_src_in, sizeof(amrex::Real) * ncells);

  // ReInit CVODE is faster
  CVodeReInit(cvode_mem, time_start, y);

  BL_PROFILE_VAR("Pele::react():CVode", AroundCVODE);
  int flag =
    CVode(cvode_mem, time_final, y, &CvodeActual_time_final, CV_NORMAL);
  // ONE STEP MODE FOR DEBUGGING
  // flag = CVode(cvode_mem, time_final, y, &CvodeActual_time_final,
  // CV_ONE_STEP);
  if (utils::check_flag(&flag, "CVode", 1) != 0) {
    return (1);
  }
  BL_PROFILE_VAR_STOP(AroundCVODE);

  // Update TypicalValues
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, udata_g->ncells,
    relTol, absTol, "cvode");

#ifdef MOD_REACTOR
  dt_react =
    time_start - CvodeActual_time_final; // Actual dt_react performed by Cvode
  time += dt_react;                      // Increment time in reactor mode
#endif

  // Pack data to return in main routine external
  std::memcpy(
    rY_in, yvec_d, sizeof(amrex::Real) * ((NUM_SPECIES + 1) * ncells));
  for (int i = 0; i < ncells; i++) {
    rX_in[i] = rX_in[i] + dt_react * rX_src_in[i];
  }

  // cppcheck-suppress knownConditionTrueFalse
  if ((udata_g->verbose > 1) && (omp_thread == 0)) {
    amrex::Print() << "Additional verbose info --\n";
    print_final_stats(cvode_mem, LS != nullptr);
    amrex::Print() << "\n -------------------------------------\n";
  }

  // Get estimate of how hard the integration process was
  long int nfe = 0;
  long int nfeLS = 0;
  CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (LS != nullptr) {
    flag = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  }
  nfe += nfeLS;
#endif

  return static_cast<int>(nfe);
}